

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiAnimMesh **_dest,aiAnimMesh *src)

{
  long lVar1;
  uint uVar2;
  aiVector3D *paVar3;
  aiColor4D *__src;
  ulong uVar4;
  aiAnimMesh *__dest;
  aiVector3D *paVar5;
  aiColor4D *__dest_00;
  long lVar6;
  aiVector3t<float> *old;
  ulong uVar7;
  
  if (src != (aiAnimMesh *)0x0 && _dest != (aiAnimMesh **)0x0) {
    __dest = (aiAnimMesh *)operator_new(0x4b0);
    *_dest = __dest;
    memcpy(__dest,src,0x4b0);
    uVar7 = (ulong)__dest->mNumVertices;
    paVar3 = __dest->mVertices;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar4 = uVar7 * 0xc;
      paVar5 = (aiVector3D *)operator_new__(uVar4);
      if (uVar7 != 0) {
        memset(paVar5,0,((uVar4 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mVertices = paVar5;
      memcpy(paVar5,paVar3,uVar4);
    }
    paVar3 = __dest->mNormals;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar4 = uVar7 * 0xc;
      paVar5 = (aiVector3D *)operator_new__(uVar4);
      if (uVar7 != 0) {
        memset(paVar5,0,((uVar4 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mNormals = paVar5;
      memcpy(paVar5,paVar3,uVar4);
    }
    paVar3 = __dest->mTangents;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar4 = uVar7 * 0xc;
      paVar5 = (aiVector3D *)operator_new__(uVar4);
      if (uVar7 != 0) {
        memset(paVar5,0,((uVar4 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mTangents = paVar5;
      memcpy(paVar5,paVar3,uVar4);
    }
    paVar3 = __dest->mBitangents;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar4 = uVar7 * 0xc;
      paVar5 = (aiVector3D *)operator_new__(uVar4);
      if (uVar7 != 0) {
        memset(paVar5,0,((uVar4 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mBitangents = paVar5;
      memcpy(paVar5,paVar3,uVar4);
    }
    lVar6 = 0;
    do {
      paVar3 = __dest->mTextureCoords[lVar6];
      if (paVar3 == (aiVector3D *)0x0) break;
      uVar2 = __dest->mNumVertices;
      uVar7 = (ulong)uVar2 * 0xc;
      paVar5 = (aiVector3D *)operator_new__(uVar7);
      if ((ulong)uVar2 != 0) {
        memset(paVar5,0,((uVar7 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mTextureCoords[lVar6] = paVar5;
      lVar6 = lVar6 + 1;
      memcpy(paVar5,paVar3,uVar7);
    } while (lVar6 != 8);
    lVar6 = 0;
    do {
      __src = __dest->mColors[lVar6];
      if (__src == (aiColor4D *)0x0) {
        return;
      }
      lVar1 = lVar6 + 1;
      uVar7 = (ulong)__dest->mNumVertices << 4;
      __dest_00 = (aiColor4D *)operator_new__(uVar7);
      __dest->mColors[lVar6] = __dest_00;
      memcpy(__dest_00,__src,uVar7);
      lVar6 = lVar1;
    } while (lVar1 != 8);
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiAnimMesh** _dest, const aiAnimMesh* src) {
    if (nullptr == _dest || nullptr == src) {
        return;
    }

    aiAnimMesh* dest = *_dest = new aiAnimMesh();

    // get a flat copy
    ::memcpy(dest, src, sizeof(aiAnimMesh));

    // and reallocate all arrays
    GetArrayCopy(dest->mVertices, dest->mNumVertices);
    GetArrayCopy(dest->mNormals, dest->mNumVertices);
    GetArrayCopy(dest->mTangents, dest->mNumVertices);
    GetArrayCopy(dest->mBitangents, dest->mNumVertices);

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy(dest->mTextureCoords[n++], dest->mNumVertices);

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy(dest->mColors[n++], dest->mNumVertices);
}